

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O3

err_t cmdFileDup(char *oname,char *iname,size_t skip,size_t count)

{
  bool_t bVar1;
  err_t eVar2;
  bool_t bVar3;
  file_t file;
  file_t file_00;
  blob_t blob;
  size_t count_00;
  size_t c;
  size_t local_40;
  size_t local_38;
  
  local_40 = count;
  file = fileOpen(iname,"rb");
  eVar2 = 0xcb;
  if (file == (file_t)0x0) {
    return 0xcb;
  }
  bVar1 = fileSeek(file,skip,0);
  if (bVar1 == 0) {
    fileClose(file);
    return 0xcf;
  }
  file_00 = fileOpen(oname,"wb");
  if (file_00 == (file_t)0x0) goto LAB_001044bb;
  blob = blobCreate(0x1000);
  if (blob == (blob_t)0x0) {
    fileClose(file_00);
    fileClose(file);
    return 0x6e;
  }
  if (count == 0) {
    blobClose(blob);
LAB_00104473:
    bVar1 = fileClose(file_00);
    bVar3 = fileClose(file);
    if (bVar1 == 0) {
      return 0x67;
    }
    if (bVar3 == 0) {
      return 0x67;
    }
    return 0;
  }
  if (count == 0xffffffffffffffff) {
    do {
      local_40 = fileRead2(blob,0x1000,file);
      if (local_40 == 0xffffffffffffffff) goto LAB_001044a6;
      eVar2 = fileWrite(&local_40,blob,local_40,file_00);
    } while ((local_40 != 0) && (eVar2 == 0));
  }
  else {
    do {
      local_38 = 0x1000;
      if (count < 0x1000) {
        local_38 = count;
      }
      count_00 = fileRead2(blob,local_38,file);
      if (count_00 != local_38) {
        local_40 = count - local_38;
        goto LAB_001044a6;
      }
      eVar2 = fileWrite(&local_38,blob,count_00,file_00);
      count = count - local_38;
      local_40 = count;
    } while ((count != 0) && (eVar2 == 0));
  }
  blobClose(blob);
  if (eVar2 == 0) goto LAB_00104473;
LAB_001044b3:
  fileClose(file_00);
LAB_001044bb:
  fileClose(file);
  return eVar2;
LAB_001044a6:
  blobClose(blob);
  eVar2 = 0xcf;
  goto LAB_001044b3;
}

Assistant:

err_t cmdFileDup(const char* oname, const char* iname, size_t skip,
	size_t count)
{
	const size_t buf_size = 4096;
	err_t code;
	file_t ifile;
	file_t ofile;
	void* buf;
	// pre
	ASSERT(strIsValid(iname) && strIsValid(oname));
	// открыть входной файл
	code = cmdFileOpen(ifile, iname, "rb");
	ERR_CALL_CHECK(code);
	// пропустить skip октетов
	if (!fileSeek(ifile, skip, SEEK_SET))
	{
		cmdFileClose(ifile);
		return ERR_FILE_READ;
	}
	// открыть выходной файл
	code = cmdFileOpen(ofile, oname, "wb");
	ERR_CALL_HANDLE(code, cmdFileClose(ifile));
	// подготовить память
	code = cmdBlobCreate(buf, buf_size);
	ERR_CALL_HANDLE(code, (cmdFileClose(ofile), cmdFileClose(ifile)));
	// дублировать count октетов
	if (count != SIZE_MAX)
		while (count && code == ERR_OK)
		{
			size_t c = MIN2(buf_size, count);
			if (fileRead2(buf, c, ifile) != c)
				code = ERR_FILE_READ;
			else
				code = fileWrite(&c, buf, c, ofile);
			count -= c;
		}
	// дублировать все
	else
		while (count && code == ERR_OK)
		{
			count = fileRead2(buf, buf_size, ifile);
			if (count == SIZE_MAX)
				code = ERR_FILE_READ;
			else 
				code = fileWrite(&count, buf, count, ofile);
		}
	// завершить
	cmdBlobClose(buf);
	ERR_CALL_HANDLE(code, (cmdFileClose(ofile), cmdFileClose(ifile)));
	code = cmdFileClose(ofile);
	ERR_CALL_HANDLE(code, cmdFileClose(ifile));
	return cmdFileClose(ifile);
}